

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JFSON.cpp
# Opt level: O2

void __thiscall JFSON::Json::Json(Json *this)

{
  statics();
  std::__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<JFSON::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)&statics::s);
  return;
}

Assistant:

Json::Json() noexcept                  : m_ptr(statics().null) {}